

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O1

string_stream * __thiscall
argh::parser::operator()
          (string_stream *__return_storage_ptr__,parser *this,string *name,double *def_val)

{
  pointer pcVar1;
  long lVar2;
  const_iterator cVar3;
  ostringstream ostr;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  key_type local_1a0 [3];
  ios_base local_130 [264];
  
  lVar2 = std::__cxx11::string::find_first_not_of((char)name,0x2d);
  if (lVar2 == -1) {
    local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,pcVar1,pcVar1 + name->_M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)local_1a0,(ulong)name);
  }
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->params_)._M_t,local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p);
  }
  if (&(this->params_)._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)cVar3._M_node) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    *(undefined8 *)
     ((long)&local_1a0[0]._M_string_length + *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18)) =
         0x15;
    std::ostream::_M_insert<double>(*def_val);
    std::__cxx11::stringbuf::str();
    std::__cxx11::istringstream::istringstream
              ((istringstream *)__return_storage_ptr__,(string *)local_1c0,_S_in);
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  else {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)__return_storage_ptr__,(string *)(cVar3._M_node + 2),_S_in);
  }
  return __return_storage_ptr__;
}

Assistant:

string_stream parser::operator()(std::string const& name, T&& def_val) const
   {
      auto optIt = params_.find(trim_leading_dashes(name));
      if (params_.end() != optIt)
         return string_stream(optIt->second);

      std::ostringstream ostr;
      ostr.precision(std::numeric_limits<long double>::max_digits10);
      ostr << def_val;
      return string_stream(ostr.str()); // use default
   }